

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O2

string * __thiscall
pbrt::ThinDielectricMaterial::ToString_abi_cxx11_
          (string *__return_storage_ptr__,ThinDielectricMaterial *this)

{
  SpectrumTextureHandle *in_R9;
  
  StringPrintf<pbrt::FloatTextureHandle_const&,pbrt::FloatTextureHandle_const&,pbrt::SpectrumTextureHandle_const&>
            (__return_storage_ptr__,
             (pbrt *)"[ ThinDielectricMaterial displacement: %s etaF: %s etaS: %s ]",(char *)this,
             &this->etaF,(FloatTextureHandle *)&this->etaS,in_R9);
  return __return_storage_ptr__;
}

Assistant:

std::string ThinDielectricMaterial::ToString() const {
    return StringPrintf("[ ThinDielectricMaterial displacement: %s etaF: %s etaS: %s ]",
                        displacement, etaF, etaS);
}